

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stronghold.cpp
# Opt level: O0

void __thiscall Stronghold::Stronghold(Stronghold *this,string *n,int t,int h,int m,int d)

{
  string local_48 [32];
  int local_28;
  int local_24;
  int d_local;
  int m_local;
  int h_local;
  int t_local;
  string *n_local;
  Stronghold *this_local;
  
  local_28 = d;
  local_24 = m;
  d_local = h;
  m_local = t;
  _h_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)n);
  BlackCard::BlackCard(&this->super_BlackCard,(string *)local_48,m_local);
  std::__cxx11::string::~string(local_48);
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b3e8;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->honour = d_local;
  this->money = local_24;
  this->initialDefense = local_28;
  return;
}

Assistant:

Stronghold::Stronghold(string n, int t, int h, int m, int d) : BlackCard{n, t}
{
    name = n;
    honour = h;
    money = m;
    initialDefense = d;
}